

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

void __thiscall CConfigManager::RestoreStrings(CConfigManager *this)

{
  if ((this->m_Values).m_ClVersionServer[0] == '\0') {
    str_copy((this->m_Values).m_ClVersionServer,"version.teeworlds.com",100);
  }
  if ((this->m_Values).m_PlayerSkin[0] == '\0') {
    str_utf8_copy_num((this->m_Values).m_PlayerSkin,"default",0x61,0x18);
  }
  if ((this->m_Values).m_PlayerSkinBody[0] == '\0') {
    str_utf8_copy_num((this->m_Values).m_PlayerSkinBody,"standard",0x61,0x18);
  }
  if ((this->m_Values).m_PlayerSkinHands[0] == '\0') {
    str_utf8_copy_num((this->m_Values).m_PlayerSkinHands,"standard",0x61,0x18);
  }
  if ((this->m_Values).m_PlayerSkinFeet[0] == '\0') {
    str_utf8_copy_num((this->m_Values).m_PlayerSkinFeet,"standard",0x61,0x18);
  }
  if ((this->m_Values).m_PlayerSkinEyes[0] == '\0') {
    str_utf8_copy_num((this->m_Values).m_PlayerSkinEyes,"standard",0x61,0x18);
  }
  if ((this->m_Values).m_UiServerAddress[0] == '\0') {
    str_copy((this->m_Values).m_UiServerAddress,"localhost:8303",0x40);
  }
  if ((this->m_Values).m_UiServerAddressLan[0] == '\0') {
    str_copy((this->m_Values).m_UiServerAddressLan,"localhost:8303",0x40);
  }
  if ((this->m_Values).m_ClMenuMap[0] == '\0') {
    str_copy((this->m_Values).m_ClMenuMap,"auto",0x40);
  }
  if ((this->m_Values).m_SvGametype[0] == '\0') {
    str_copy((this->m_Values).m_SvGametype,"dm",0x20);
  }
  if ((this->m_Values).m_PlayerName[0] == '\0') {
    str_utf8_copy_num((this->m_Values).m_PlayerName,"nameless tee",0x41,0x10);
  }
  if ((this->m_Values).m_SvName[0] == '\0') {
    str_copy((this->m_Values).m_SvName,"unnamed server",0x80);
  }
  if ((this->m_Values).m_SvMap[0] == '\0') {
    str_copy((this->m_Values).m_SvMap,"dm1",0x80);
  }
  if ((this->m_Values).m_SvMaplist[0] == '\0') {
    str_copy((this->m_Values).m_SvMaplist,"all",0x20);
  }
  if ((this->m_Values).m_EcBindaddr[0] == '\0') {
    str_copy((this->m_Values).m_EcBindaddr,"localhost",0x80);
  }
  if ((this->m_Values).m_DbgStressServer[0] != '\0') {
    return;
  }
  str_copy((this->m_Values).m_DbgStressServer,"localhost",0x20);
  return;
}

Assistant:

void CConfigManager::RestoreStrings()
{
	#define MACRO_CONFIG_INT(Name,ScriptName,def,min,max,flags,desc)	// nop
	#define MACRO_CONFIG_STR(Name,ScriptName,len,def,flags,desc) if(!m_Values.m_##Name[0] && def[0]) str_copy(m_Values.m_##Name, def, len);
	#define MACRO_CONFIG_UTF8STR(Name,ScriptName,size,len,def,flags,desc) if(!m_Values.m_##Name[0] && def[0]) str_utf8_copy_num(m_Values.m_##Name, def, size, len);

	#include "config_variables.h"

	#undef MACRO_CONFIG_INT
	#undef MACRO_CONFIG_STR
	#undef MACRO_CONFIG_UTF8STR
}